

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O1

void __thiscall xray_re::xr_spawn_object::save_v12(xr_spawn_object *this,xr_ini_writer *w)

{
  int iVar1;
  pointer pcVar2;
  xr_ini_packet *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  xr_custom_object_vec objects;
  vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    xr_ini_writer::write(w,0x1f2998,(void *)0x1,in_RCX);
  }
  xr_ini_writer::write
            (w,0x1f274f,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,in_RCX);
  xr_ini_writer::write(w,0x1f3d25,(void *)0x17,in_RCX);
  iVar1 = *(int *)&(this->super_xr_custom_object).field_0x6c;
  if (iVar1 == 0) {
    xr_ini_writer::write(w,0x1f132b,(void *)(ulong)(this->field_1).field_0.m_game,in_RCX);
    __n = 0;
    xr_ini_writer::write(w,0x1f29fb,"",0);
    xr_ini_writer::write(w,0x1f2a06,(void *)(ulong)(this->field_1).field_0.m_respawn,__n);
    xr_ini_writer::write(w,0x1f2a0e,(void *)(ulong)(this->field_1).field_0.m_team,__n);
  }
  else if (iVar1 == 1) {
    xr_ini_writer::write(w,0x1f2a16,(void *)(ulong)(this->field_1).field_1.m_ambient_color,in_RCX);
    xr_ini_writer::write(w,0x1f2a24,(void *)0xffff,in_RCX);
    xr_ini_writer::write(w,0x1f2a2d,__buf,in_RCX);
    xr_ini_writer::write(w,0x1f2a36,__buf_00,in_RCX);
    xr_ini_writer::write(w,0x1f2a40,(void *)(ulong)(this->field_1).field_1.m_fog_color,in_RCX);
    xr_ini_writer::write(w,0x1f2a4a,__buf_01,in_RCX);
    xr_ini_writer::write(w,0x1f2a56,(void *)(ulong)(this->field_1).field_1.m_hemi_color,in_RCX);
    xr_ini_writer::write(w,0x1f2a61,(void *)(ulong)(this->field_1).field_1.m_sky_color,in_RCX);
    xr_ini_writer::write(w,0x1f2a6b,__buf_02,in_RCX);
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xc6,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    if ((this->field_1).m_entity == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xa1,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    xr_ini_writer::open_section(w,"spawndata");
    this_00 = (xr_ini_packet *)operator_new(0x11a8);
    xr_ini_packet::xr_ini_packet(this_00);
    cse_abstract::spawn_write((this->field_1).m_entity,(xr_packet *)this_00,true);
    xr_ini_writer::write_packet(w,this_00);
    xr_ini_writer::write(w,0x1f29f8,(void *)0x0,in_RCX);
    pcVar2 = (((this->field_1).m_entity)->m_s_name)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,
               pcVar2 + (((this->field_1).m_entity)->m_s_name)._M_string_length);
    xr_ini_writer::write(w,0x1f01b6,(string *)local_48,0);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    xr_ini_writer::close_section(w);
    operator_delete(this_00,0x1018);
  }
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    *local_68.
     super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
     _M_impl.super__Vector_impl_data._M_start = this->m_attached_object;
    local_68.
    super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    xr_scene::save_objects((this->super_xr_custom_object).m_scene,w,&local_68,"attached");
    if (local_68.
        super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void xr_spawn_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	if (this->m_attached_object)
		w->write("attached_count", 1);

	w->write("type", this->m_type);
	w->write("version", SPAWNPOINT_VERSION_V12);

	if (m_type == SPAWNPOINT_TYPE_ENTITY) {
		xr_assert(m_entity);

		w->open_section("spawndata");
		
		xr_ini_packet *ini_packet = new xr_ini_packet();
		xr_packet* packet = ini_packet;
		m_entity->spawn_write(*packet, true);
		//w->w_packet(*ini_packet);
		w->write_packet(ini_packet);

		w->write("fl", 0);
		w->write("name", this->m_entity->name(), false);
		w->close_section();

		delete packet;
	}
	else if (m_type == SPAWNPOINT_TYPE_RPOINT)
	{
		w->write("game_type", m_game);
		w->write("rp_profile", "", false);
		w->write("rp_type", m_respawn);
		w->write("team_id", m_team);
	} 
	else if (m_type == SPAWNPOINT_TYPE_ENV_MOD)
	{
		w->write("ambient_color", m_ambient_color);
		w->write("em_flags", 65535); // apparently em_flags don't exist in current code
		w->write("em_power", m_power);
		w->write("em_radius", m_radius);
		w->write("fog_color", m_fog_color);
		w->write("fog_density", m_fog_density);
		w->write("hemi_color", m_hemi_color);
		w->write("sky_color", m_sky_color);
		w->write("view_dist", m_view_distance);
	}
	else
	{
		xr_not_expected();
	}
	
	if (this->m_attached_object)
	{
		xr_custom_object_vec objects(1, m_attached_object);
		scene().save_objects(w, objects, "attached");
	}
}